

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

Extension * __thiscall
google::protobuf::internal::ExtensionSet::MaybeNewRepeatedExtension
          (ExtensionSet *this,FieldDescriptor *descriptor)

{
  bool bVar1;
  Type TVar2;
  FieldDescriptor *in_RSI;
  size_t *in_RDI;
  Extension *extension;
  size_t n;
  Arena **in_stack_fffffffffffffe58;
  void *in_stack_fffffffffffffe60;
  type_info *in_stack_fffffffffffffe68;
  Arena *in_stack_fffffffffffffe70;
  ArenaImpl *n_00;
  ArenaImpl *this_00;
  Extension **in_stack_fffffffffffffe88;
  FieldDescriptor *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe9c;
  ExtensionSet *in_stack_fffffffffffffea0;
  Extension *local_80;
  string *local_38;
  
  FieldDescriptor::number(in_RSI);
  bVar1 = MaybeNewExtension(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                            in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (bVar1) {
    TVar2 = FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffffe70);
    local_80->type = (FieldType)TVar2;
    local_80->is_repeated = true;
    n_00 = (ArenaImpl *)*in_RDI;
    if (n_00 == (ArenaImpl *)0x0) {
      local_38 = (string *)operator_new(0x18);
      RepeatedPtrField<google::protobuf::MessageLite>::RepeatedPtrField
                ((RepeatedPtrField<google::protobuf::MessageLite> *)0x565905);
    }
    else {
      this_00 = n_00;
      AlignUpTo8(0x18);
      Arena::AllocHook(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                       (size_t)in_stack_fffffffffffffe60);
      ArenaImpl::AllocateAlignedAndAddCleanup
                (this_00,(size_t)n_00,(_func_void_void_ptr *)in_stack_fffffffffffffe70);
      local_38 = (string *)
                 Arena::
                 InternalHelper<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>::
                 Construct<google::protobuf::Arena*>
                           (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    }
    (local_80->field_0).string_value = local_38;
  }
  return local_80;
}

Assistant:

ExtensionSet::Extension* ExtensionSet::MaybeNewRepeatedExtension(
    const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->repeated_message_value =
        Arena::CreateMessage<RepeatedPtrField<MessageLite> >(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, MESSAGE);
  }
  return extension;
}